

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  ImGuiTabBar *pIVar1;
  ImGuiWindow *window;
  ImGuiWindow **ppIVar2;
  byte bVar3;
  int n;
  long lVar4;
  long lVar5;
  
  pIVar1 = src_node->TabBar;
  if ((pIVar1 == (ImGuiTabBar *)0x0) || (dst_node->TabBar != (ImGuiTabBar *)0x0)) {
    bVar3 = 0;
  }
  else {
    dst_node->TabBar = pIVar1;
    src_node->TabBar = (ImGuiTabBar *)0x0;
    bVar3 = 1;
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (src_node->Windows).Size; lVar4 = lVar4 + 1) {
    if (pIVar1 == (ImGuiTabBar *)0x0) {
      ppIVar2 = (ImGuiWindow **)((long)(src_node->Windows).Data + lVar5);
    }
    else {
      ppIVar2 = &(pIVar1->Tabs).Data[lVar4].Window;
    }
    window = *ppIVar2;
    window->DockNode = (ImGuiDockNode *)0x0;
    window->field_0x43a = window->field_0x43a & 0xfe;
    DockNodeAddWindow(dst_node,window,(bool)(bVar3 ^ 1));
    lVar5 = lVar5 + 8;
  }
  ImVector<ImGuiWindow_*>::clear(&src_node->Windows);
  if ((bVar3 == 0) && (src_node->TabBar != (ImGuiTabBar *)0x0)) {
    if (dst_node->TabBar != (ImGuiTabBar *)0x0) {
      dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
    }
    DockNodeRemoveTabBar(src_node);
    return;
  }
  return;
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size == src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n];
        window->DockNode = NULL;
        window->DockIsActive = false;
        DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}